

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O3

void xPredIntraAngAdi_XY_16(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  pel first_line [192];
  undefined1 auStack_f8 [200];
  
  uVar4 = iHeight / 2;
  uVar6 = (uVar4 + iWidth) - 1;
  uVar5 = uVar4 - 1;
  lVar9 = (long)(int)(uVar4 + iWidth + 0xe & 0xfffffff0);
  pbVar7 = pSrc + -(long)(iHeight + -2);
  pbVar8 = pbVar7;
  if ((int)uVar5 < 1) {
    uVar10 = 0;
  }
  else {
    uVar11 = 0;
    uVar12 = (uint)*pbVar7;
    do {
      bVar1 = pbVar7[uVar11 * 2 + 1];
      pbVar8 = pbVar8 + 2;
      bVar2 = pbVar7[uVar11 * 2 + 2];
      auStack_f8[uVar11] = (char)(uVar12 + (uint)bVar1 * 2 + (uint)bVar2 + 2 >> 2);
      auStack_f8[uVar11 + lVar9] =
           (char)((uint)pbVar7[uVar11 * 2 + -1] + (uint)bVar1 + uVar12 * 2 + 2 >> 2);
      uVar11 = uVar11 + 1;
      uVar12 = (uint)bVar2;
      uVar10 = uVar5;
    } while (uVar5 != uVar11);
  }
  if ((int)uVar10 < (int)uVar6) {
    uVar11 = (ulong)uVar10;
    lVar13 = 0;
    do {
      bVar1 = pbVar8[lVar13 + -1];
      bVar2 = pbVar8[lVar13];
      bVar3 = pbVar8[lVar13 + 1];
      auStack_f8[lVar13 + uVar11] =
           (char)((uint)pbVar8[lVar13 + 2] + (uint)bVar1 + ((uint)bVar3 + (uint)bVar2) * 3 + 4 >> 3)
      ;
      auStack_f8[lVar13 + lVar9 + uVar11] =
           (char)((uint)bVar1 + (uint)bVar2 * 2 + (uint)bVar3 + 2 >> 2);
      lVar13 = lVar13 + 1;
    } while (uVar6 - uVar11 != lVar13);
  }
  if (1 < iHeight) {
    lVar13 = 0;
    do {
      memcpy(dst,auStack_f8 + lVar13 + (int)uVar5,(long)iWidth);
      memcpy(dst + i_dst,auStack_f8 + lVar13 + (int)uVar5 + lVar9,(long)iWidth);
      dst = dst + i_dst * 2;
      lVar13 = lVar13 + -1;
    } while (-lVar13 != (ulong)uVar4);
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_XY_16(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    ALIGNED_16(pel first_line[2 * (64 + 32)]);
    int line_size = iWidth + iHeight / 2 - 1;
    int left_size = line_size - iWidth;
    int aligned_line_size = ((line_size + 15) >> 4) << 4;
    pel *pfirst[2] = { first_line, first_line + aligned_line_size };

    int i;

    pSrc -= iHeight - 2;

    for (i = 0; i < left_size; i++, pSrc += 2) {
        pfirst[0][i] = (pSrc[0] + pSrc[1] * 2 + pSrc[2] + 2) >> 2;
        pfirst[1][i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
    }

    for (; i < line_size; i++, pSrc++) {
        pfirst[0][i] = (pSrc[-1] + (pSrc[0] + pSrc[1]) * 3 + pSrc[2] + 4) >> 3;
        pfirst[1][i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
    }

    pfirst[0] += left_size;
    pfirst[1] += left_size;

    iHeight /= 2;

    for (i = 0; i < iHeight; i++) {
        memcpy(dst, pfirst[0] - i, iWidth * sizeof(pel));
        memcpy(dst + i_dst, pfirst[1] - i, iWidth * sizeof(pel));
        dst += 2 * i_dst;
    }
}